

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O1

void __thiscall DnsStats::RegisterEdnsUsage(DnsStats *this,uint32_t flags,uint32_t *e_rcode)

{
  uint32_t number;
  ulong uVar1;
  int i;
  uint uVar2;
  
  uVar1 = (ulong)(flags | 0x8000);
  if (this->dnssec_packet == (uint8_t *)0x0) {
    uVar1 = (ulong)flags;
  }
  if (e_rcode != (uint32_t *)0x0) {
    *e_rcode = (uint32_t)(uVar1 >> 0x18);
  }
  this->is_using_edns = true;
  this->is_do_flag_set = (bool)((byte)(uVar1 >> 0xf) & 1);
  uVar2 = 0;
  number = 0xf;
  do {
    if (((uint)uVar1 >> (uVar2 & 0x1f) & 1) != 0) {
      SubmitRegistryNumberAndCount(this,10,number,1);
    }
    uVar2 = uVar2 + 1;
    number = number - 1;
  } while (uVar2 != 0x10);
  SubmitRegistryNumberAndCount(this,0xb,(uint)uVar1 >> 0x10 & 0xff,1);
  return;
}

Assistant:

void DnsStats::RegisterEdnsUsage(uint32_t flags, uint32_t* e_rcode)
{
    /* Little safety because flags are set differently for some packets */
    if (dnssec_packet != NULL) {
        flags |= (1 << 15);
    }
    /* Process the flags and rcodes */
    if (e_rcode != NULL)
    {
        *e_rcode = (flags >> 24) & 0xFF;
    }

    /* Register that EDNS was used */
    is_using_edns = true;

    /* Register whether the DO bit was set */
    is_do_flag_set = (flags & (1 << 15)) != 0;

    /* Add flags to registration */
    for (int i = 0; i < 16; i++)
    {
        if ((flags & (1 << i)) != 0)
        {
            SubmitRegistryNumber(REGISTRY_EDNS_Header_Flags, 15 - i);
        }
    }

    SubmitRegistryNumber(REGISTRY_EDNS_Version_number, (flags >> 16) & 0xFF);
}